

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::~Codegen(Codegen *this)

{
  pointer puVar1;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  ::~_Rb_tree(&(this->inline_hint)._M_t);
  puVar1 = (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->bb_ordering).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
  ::~_Rb_tree(&(this->stack_space_allocation)._M_t);
  std::
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->phi_reg)._M_h);
  std::
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->fixed_vars)._M_h);
  std::
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->var_collapse)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->var_use)._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  ::~_Rb_tree(&(this->consts)._M_t);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->reg_map)._M_t);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector(&this->inst);
  return;
}

Assistant:

Codegen(mir::inst::MirFunction& func, mir::inst::MirPackage& package,
          std::map<std::string, std::any>& extra_data,
          bool enable_cond_exec = true)
      : func(func),
        package(package),
        extra_data(extra_data),
        inst(),
        reg_map(),
        fixed_vars(),
        var_collapse(),
        bb_ordering(),
        enable_cond_exec(enable_cond_exec) {
    {
      // Calculate ordering
      auto any_ordering =
          extra_data.find(optimization::BASIC_BLOCK_ORDERING_DATA_NAME);
      if (any_ordering != extra_data.end()) {
        auto& order_map = std::any_cast<optimization::BasicBlockOrderingType&>(
            any_ordering->second);
        auto o = order_map.find(func.name);
        if (o != order_map.end()) {
          LOG(TRACE) << "Found order map for " << func.name << " with "
                     << o->second.size() << " elements" << std::endl;
          auto& ordering = o->second;
          this->bb_ordering.insert(bb_ordering.end(), ordering.begin(),
                                   ordering.end());
        } else {
          LOG(TRACE) << "Cannot find order map for " << func.name << " (1)"
                     << std::endl;
          for (auto& a : func.basic_blks) {
            bb_ordering.push_back(a.first);
          }
        }
      } else {
        LOG(TRACE) << "Cannot find order map for " << func.name << " (2)"
                   << std::endl;
        for (auto& a : func.basic_blks) {
          bb_ordering.push_back(a.first);
        }
      }
    }
    auto inline_hint = extra_data.find(optimization::inline_blks);
    if (inline_hint != extra_data.end()) {
      LOG(TRACE) << "Found inline hint in extra data" << std::endl;

      this->inline_hint =
          std::any_cast<optimization::InlineBlksType&>(inline_hint->second)
              .at(func.name);

      LOG(TRACE) << "Inline hint has " << this->inline_hint.size()
                 << " items: ";
      for (auto i : this->inline_hint) LOG(TRACE) << i.first << " ";
      LOG(TRACE) << std::endl;
    }
    param_size = func.type->params.size();
  }